

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::Canceler::cancel(Canceler *this,StringPtr cancelReason)

{
  bool bVar1;
  StringPtr *params;
  String local_1c8;
  Exception local_1b0;
  Canceler *local_20;
  Canceler *this_local;
  StringPtr cancelReason_local;
  
  cancelReason_local.content.ptr = (char *)cancelReason.content.size_;
  this_local = (Canceler *)cancelReason.content.ptr;
  local_20 = this;
  bVar1 = isEmpty(this);
  if (!bVar1) {
    str<kj::StringPtr&>(&local_1c8,(kj *)&this_local,params);
    Exception::Exception
              (&local_1b0,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0xdc,&local_1c8);
    cancel(this,&local_1b0);
    Exception::~Exception(&local_1b0);
    String::~String(&local_1c8);
  }
  return;
}

Assistant:

void Canceler::cancel(StringPtr cancelReason) {
  if (isEmpty()) return;
  // We can't use getDestructionReason() here because if an exception is in-flight, it would use
  // that exception, totally discarding the reason given by the caller. This would probably be
  // unexpected. The caller can always use getDestructionReason() themselves if desired.
  cancel(Exception(Exception::Type::DISCONNECTED, __FILE__, __LINE__, kj::str(cancelReason)));
}